

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

KeyValue *
google::protobuf::Arena::CreateArray<google::protobuf::internal::ExtensionSet::KeyValue>
          (Arena *arena,size_t num_elements)

{
  unsigned_long uVar1;
  LogMessage *pLVar2;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  size_t local_20;
  size_t num_elements_local;
  Arena *arena_local;
  
  local_20 = num_elements;
  num_elements_local = (size_t)arena;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  local_59 = 0;
  if (uVar1 >> 5 < num_elements) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
               ,0x14c);
    local_59 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                       );
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"Requested size is too large to fit into size_t.");
    internal::LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (num_elements_local == 0) {
    arena_local = (Arena *)operator_new__(local_20 << 5);
  }
  else {
    arena_local = (Arena *)CreateInternalRawArray<google::protobuf::internal::ExtensionSet::KeyValue>
                                     ((Arena *)num_elements_local,local_20);
  }
  return (KeyValue *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateArray(Arena* arena,
                                               size_t num_elements) {
    static_assert(std::is_trivial<T>::value,
                  "CreateArray requires a trivially constructible type");
    static_assert(std::is_trivially_destructible<T>::value,
                  "CreateArray requires a trivially destructible type");
    GOOGLE_CHECK_LE(num_elements, std::numeric_limits<size_t>::max() / sizeof(T))
        << "Requested size is too large to fit into size_t.";
    if (arena == NULL) {
      return static_cast<T*>(::operator new[](num_elements * sizeof(T)));
    } else {
      return arena->CreateInternalRawArray<T>(num_elements);
    }
  }